

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lar2par.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  ostringstream error_message_6;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> coefficients;
  int length;
  ostringstream error_message_4;
  LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients;
  istream *input_stream;
  ostringstream error_message_3;
  ifstream ifs;
  ostringstream error_message_2;
  char *input_file;
  ostringstream error_message_1;
  int num_input_files;
  ostringstream error_message;
  int option_char;
  int num_order;
  option *in_stack_fffffffffffff128;
  ostream *in_stack_fffffffffffff130;
  LogAreaRatioToParcorCoefficients *in_stack_fffffffffffff138;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffff140;
  int in_stack_fffffffffffff144;
  size_type in_stack_fffffffffffff148;
  undefined6 in_stack_fffffffffffff150;
  undefined1 in_stack_fffffffffffff156;
  undefined1 in_stack_fffffffffffff157;
  int *actual_write_size;
  istream *in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff170;
  char *pcVar7;
  int in_stack_fffffffffffff180;
  undefined1 in_stack_fffffffffffff186;
  int *in_stack_fffffffffffff190;
  char *local_e40;
  allocator local_df1;
  string local_df0 [32];
  ostringstream local_dd0 [232];
  ostringstream *in_stack_fffffffffffff318;
  string *in_stack_fffffffffffff320;
  allocator local_c51;
  string local_c50 [32];
  ostringstream local_c30 [383];
  int local_ab1 [6];
  int local_a98;
  allocator local_a91;
  string local_a90 [32];
  ostringstream local_a70 [376];
  LogAreaRatioToParcorCoefficients local_8f8;
  char *local_8e8;
  undefined4 local_8e0;
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  char local_740 [527];
  allocator local_531;
  string local_530 [32];
  ostringstream local_510 [376];
  char *local_398;
  allocator local_389;
  string local_388 [32];
  ostringstream local_368 [376];
  int local_1f0;
  allocator local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [399];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_18 = ya_getopt_long(in_stack_fffffffffffff144,(char **)in_stack_fffffffffffff138,
                                   (char *)in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                                   (int *)0x10370f), pcVar7 = ya_optarg, local_18 != -1) {
    if (local_18 == 0x68) {
      anon_unknown.dwarf_1727::PrintUsage(in_stack_fffffffffffff130);
      return 0;
    }
    if (local_18 != 0x6d) {
      anon_unknown.dwarf_1727::PrintUsage(in_stack_fffffffffffff130);
      return 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar7,&local_39);
    bVar1 = sptk::ConvertStringToInteger
                      ((string *)in_stack_fffffffffffff138,(int *)in_stack_fffffffffffff130);
    bVar5 = local_14 < 0;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (!bVar1 || bVar5) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar4 = std::operator<<((ostream *)local_1c8,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"lar2par",&local_1e9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      return local_4;
    }
  }
  local_1f0 = local_8 - ya_optind;
  if (1 < local_1f0) {
    std::__cxx11::ostringstream::ostringstream(local_368);
    std::operator<<((ostream *)local_368,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"lar2par",&local_389);
    sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_368);
    return local_4;
  }
  if (local_1f0 == 0) {
    local_e40 = (char *)0x0;
  }
  else {
    local_e40 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_398 = local_e40;
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    std::operator<<((ostream *)local_510,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"lar2par",&local_531);
    sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_510);
    return local_4;
  }
  std::ifstream::ifstream(local_740);
  pcVar7 = local_398;
  if (local_398 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_740,(_Ios_Openmode)pcVar7);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_8b8);
      poVar4 = std::operator<<((ostream *)local_8b8,"Cannot open file ");
      std::operator<<(poVar4,local_398);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d8,"lar2par",&local_8d9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
      std::__cxx11::string::~string(local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      local_4 = 1;
      local_8e0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_8b8);
      goto LAB_001043b6;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    pcVar7 = (char *)&std::cin;
  }
  else {
    pcVar7 = local_740;
  }
  local_8e8 = pcVar7;
  sptk::LogAreaRatioToParcorCoefficients::LogAreaRatioToParcorCoefficients(&local_8f8,local_14);
  uVar3 = sptk::LogAreaRatioToParcorCoefficients::IsValid(&local_8f8);
  if ((bool)uVar3) {
    local_a98 = local_14 + 1;
    actual_write_size = local_ab1;
    std::allocator<double>::allocator((allocator<double> *)0x104033);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffff157,
                        CONCAT16(in_stack_fffffffffffff156,in_stack_fffffffffffff150)),
               in_stack_fffffffffffff148,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
    std::allocator<double>::~allocator((allocator<double> *)0x104059);
    do {
      bVar1 = sptk::ReadStream<double>
                        ((bool)in_stack_fffffffffffff186,in_stack_fffffffffffff180,
                         (int)((ulong)pcVar7 >> 0x20),(int)pcVar7,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(uVar3,in_stack_fffffffffffff170),in_stack_fffffffffffff168,
                         in_stack_fffffffffffff190);
      if (!bVar1) {
        local_4 = 0;
        local_8e0 = 1;
        goto LAB_0010437a;
      }
      bVar1 = sptk::LogAreaRatioToParcorCoefficients::Run
                        (in_stack_fffffffffffff138,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff130);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_c30);
        std::operator<<((ostream *)local_c30,
                        "Failed to convert log area ratio to PARCOR coefficients");
        paVar6 = &local_c51;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c50,"lar2par",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
        std::__cxx11::string::~string(local_c50);
        std::allocator<char>::~allocator((allocator<char> *)&local_c51);
        local_4 = 1;
        local_8e0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_c30);
        goto LAB_0010437a;
      }
      bVar1 = sptk::WriteStream<double>
                        (in_stack_fffffffffffff180,(int)((ulong)pcVar7 >> 0x20),
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(uVar3,in_stack_fffffffffffff170),
                         (ostream *)in_stack_fffffffffffff168,actual_write_size);
      in_stack_fffffffffffff144 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff144);
    } while (bVar1);
    std::__cxx11::ostringstream::ostringstream(local_dd0);
    std::operator<<((ostream *)local_dd0,"Failed to write PARCOR coefficients");
    paVar6 = &local_df1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_df0,"lar2par",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    std::__cxx11::string::~string(local_df0);
    std::allocator<char>::~allocator((allocator<char> *)&local_df1);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_dd0);
LAB_0010437a:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_a70);
    std::operator<<((ostream *)local_a70,"Failed to initialize LogAreaRatioToParcorCoefficients");
    paVar6 = &local_a91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a90,"lar2par",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    std::__cxx11::string::~string(local_a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_a91);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a70);
  }
  sptk::LogAreaRatioToParcorCoefficients::~LogAreaRatioToParcorCoefficients(&local_8f8);
LAB_001043b6:
  std::ifstream::~ifstream(local_740);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lar2par", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients(
      num_order);
  if (!log_area_ratio_to_parcor_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LogAreaRatioToParcorCoefficients";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!log_area_ratio_to_parcor_coefficients.Run(&coefficients)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert log area ratio to PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }

  return 0;
}